

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_push.c
# Opt level: O2

ssize_t mpt_array_push(mpt_encode_array *arr,size_t len,void *data)

{
  size_t *psVar1;
  void *__dest;
  mpt_buffer *pmVar2;
  ulong uVar3;
  int type;
  iovec *piVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  iovec dest;
  iovec src;
  
  if (arr->_enc == (mpt_data_encoder_t)0x0) {
    if (len == 0) {
      psVar1 = &(arr->_state).done;
      *psVar1 = *psVar1 + (arr->_state).scratch;
      (arr->_state).scratch = 0;
      return 0;
    }
    if (data != (void *)0x0) {
      pmVar2 = (arr->_d)._buf;
      if ((pmVar2 != (mpt_buffer *)0x0) && (pmVar2->_content_traits != (mpt_type_traits *)0x0)) {
        return -3;
      }
      sVar9 = (arr->_state).scratch + (arr->_state).done;
      __dest = mpt_array_insert(&arr->_d,sVar9,len);
      if (__dest == (void *)0x0) {
        return -0x11;
      }
      pmVar2 = (arr->_d)._buf;
      memcpy(__dest,data,len);
      psVar1 = &(arr->_state).scratch;
      *psVar1 = *psVar1 + len;
      pmVar2->_used = sVar9 + len;
      return len;
    }
    return -0x10;
  }
  pmVar2 = (arr->_d)._buf;
  lVar7 = (arr->_state).scratch + (arr->_state).done;
  sVar9 = 0x40;
  if (0x40 < len) {
    sVar9 = len;
  }
  if (pmVar2 == (mpt_buffer *)0x0) {
    if (lVar7 != 0) {
      return -1;
    }
    pmVar2 = _mpt_buffer_alloc(sVar9,0);
  }
  else {
    if (pmVar2->_content_traits != (mpt_type_traits *)0x0) {
      return -3;
    }
    pmVar2 = (*pmVar2->_vptr->detach)(pmVar2,lVar7 + sVar9);
  }
  if (pmVar2 == (mpt_buffer *)0x0) {
    return -4;
  }
  (arr->_d)._buf = pmVar2;
  lVar7 = 0;
LAB_0010953c:
  do {
    lVar5 = pmVar2->_used - ((arr->_state).scratch + (arr->_state).done);
    if (lVar5 < 0) {
      return -1;
    }
    dest.iov_base = (void *)(lVar5 + 0x20 + (long)pmVar2);
    dest.iov_len = pmVar2->_size - lVar5;
    if (len == 0) {
      piVar4 = (iovec *)0x0;
    }
    else {
      piVar4 = &src;
      src.iov_base = data;
      src.iov_len = len;
    }
    uVar3 = (*arr->_enc)(&arr->_state,&dest,piVar4);
    uVar6 = lVar5 + (arr->_state).done + (arr->_state).scratch;
    uVar10 = pmVar2->_size;
    if (uVar10 < uVar6) {
      pcVar8 = "invalid encoder data size";
      type = 1;
LAB_00109662:
      mpt_log((mpt_logger *)0x0,"mpt_array_push",type,"%s: %zi > %zu",pcVar8,uVar6,uVar10);
      (*arr->_enc)(&arr->_state,(iovec *)0x0,(iovec *)0x0);
      return -8;
    }
    pmVar2->_used = uVar6;
    if (uVar3 == 0xffffffffffffffef) {
      pmVar2 = (*pmVar2->_vptr->detach)(pmVar2,uVar10 + 0x40);
      if (pmVar2 == (mpt_buffer *)0x0) {
        if (lVar7 == 0) {
          return -0x11;
        }
        return lVar7;
      }
      (arr->_d)._buf = pmVar2;
      goto LAB_0010953c;
    }
    if ((long)uVar3 < 0) {
      if (lVar7 == 0) {
        return uVar3;
      }
      return lVar7;
    }
    if ((data == (void *)0x0) || (len == 0)) {
LAB_00109623:
      return uVar3 + lVar7;
    }
    if (len < uVar3) {
      pcVar8 = "bad encoder return size";
      type = 2;
      uVar6 = uVar3;
      uVar10 = len;
      goto LAB_00109662;
    }
    if (len - uVar3 == 0) goto LAB_00109623;
    data = (void *)((long)data + uVar3);
    lVar7 = lVar7 + uVar3;
    len = len - uVar3;
  } while( true );
}

Assistant:

extern ssize_t mpt_array_push(MPT_STRUCT(encode_array) *arr, size_t len, const void *data)
{
	MPT_STRUCT(buffer) *b;
	ssize_t max, add;
	
	/* fast path for raw data */
	if (!arr->_enc) {
		void *dest;
		if (!len) {
			arr->_state.done += arr->_state.scratch;
			arr->_state.scratch = 0;
			return 0;
		}
		if (!data) {
			return MPT_ERROR(MissingData);
		}
		if ((b = arr->_d._buf)
		    && b->_content_traits) {
			return MPT_ERROR(BadType);
		}
		max = arr->_state.done + arr->_state.scratch;
		if (!(dest = mpt_array_insert(&arr->_d, max, len))) {
			return MPT_ERROR(MissingBuffer);
		}
		b = arr->_d._buf;
		memcpy(dest, data, len);
		arr->_state.scratch += len;
		b->_used = max + len;
		
		return len;
	}
	max = arr->_state.done + arr->_state.scratch;
	add = len > 64 ? len : 64;
	
	/* current buffer data */
	if (!(b = arr->_d._buf)) {
		if (max) {
			return MPT_ERROR(BadArgument);
		}
		/* use initial data size */
		if (!(b = _mpt_buffer_alloc(add, 0))) {
			return MPT_ERROR(BadOperation);
		}
		arr->_d._buf = b;
	}
	else if (b->_content_traits) {
		return MPT_ERROR(BadType);
	}
	else if (!(b = b->_vptr->detach(b, max + add))) {
		return MPT_ERROR(BadOperation);
	}
	else {
		arr->_d._buf = b;
	}
	max = 0;
	
	while (1) {
		struct iovec dest;
		ssize_t cont, off;
		
		off = arr->_state.done + arr->_state.scratch;
		
		if ((off = b->_used - off) < 0) {
			return MPT_ERROR(BadArgument);
		}
		dest.iov_base = ((uint8_t *) (b + 1)) + off;
		dest.iov_len  = b->_size - off;
		
		/* next regular operation */
		if (!len) {
			cont = arr->_enc(&arr->_state, &dest, 0);
		} else {
			struct iovec src;
			src.iov_base = (void *) data;
			src.iov_len  = len;
			cont = arr->_enc(&arr->_state, &dest, &src);
		}
		off += arr->_state.done + arr->_state.scratch;
		
		/* size update */
		if (b->_size < (size_t) off) {
			mpt_log(0, __func__, MPT_LOG(Fatal), "%s: %zi > %zu",
			        MPT_tr("invalid encoder data size"), off, (size_t) b->_size);
			arr->_enc(&arr->_state, 0, 0);
			return MPT_ERROR(BadEncoding);
		}
		b->_used = off;
		
		/* require larger buffer */
		if (cont == MPT_ERROR(MissingBuffer)) {
			if (!(b = b->_vptr->detach(b, b->_size + 64))) {
				return max ? max : MPT_ERROR(MissingBuffer);
			}
			arr->_d._buf = b;
			continue;
		}
		if (cont < 0) {
			return max ? max : cont;
		}
		/* positive no error except for incomplete write */
		if (!data || !len) {
			return max + cont;
		}
		/* space error */
		if (len < (size_t) cont) {
			mpt_log(0, __func__, MPT_LOG(Critical), "%s: %zi > %zu",
			        MPT_tr("bad encoder return size"), cont, len);
			arr->_enc(&arr->_state, 0, 0);
			return MPT_ERROR(BadEncoding);
		}
		/* all data processed */
		if (!(len -= cont)) {
			return max + cont;
		}
		/* advance source data offset */
		data = ((uint8_t *) data) + cont;
		max += cont;
	}
}